

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp_search.c
# Opt level: O0

int save_interp_filter_search_stat
              (MB_MODE_INFO *mbmi,int64_t rd,uint pred_sse,
              INTERPOLATION_FILTER_STATS *interp_filter_stats,int interp_filter_stats_idx)

{
  long in_RCX;
  long in_RDI;
  int in_R8D;
  INTERPOLATION_FILTER_STATS stat;
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  undefined1 local_44;
  undefined1 local_43;
  undefined1 local_42;
  uint local_40;
  int local_24;
  
  local_24 = in_R8D;
  if (in_R8D < 0x80) {
    local_50 = *(undefined4 *)(in_RDI + 0x14);
    local_4c = *(undefined4 *)(in_RDI + 8);
    local_48 = *(undefined4 *)(in_RDI + 0xc);
    local_44 = *(undefined1 *)(in_RDI + 0x10);
    local_43 = *(undefined1 *)(in_RDI + 0x11);
    local_42 = *(undefined1 *)(in_RDI + 0x53);
    local_40 = (uint)((byte)((ushort)*(undefined2 *)(in_RDI + 0xa7) >> 9) & 1);
    memcpy((void *)(in_RCX + (long)in_R8D * 0x28),&local_50,0x28);
    local_24 = local_24 + 1;
  }
  return local_24;
}

Assistant:

static inline int save_interp_filter_search_stat(
    MB_MODE_INFO *const mbmi, int64_t rd, unsigned int pred_sse,
    INTERPOLATION_FILTER_STATS *interp_filter_stats,
    int interp_filter_stats_idx) {
  if (interp_filter_stats_idx < MAX_INTERP_FILTER_STATS) {
    INTERPOLATION_FILTER_STATS stat = { mbmi->interp_filters,
                                        { mbmi->mv[0], mbmi->mv[1] },
                                        { mbmi->ref_frame[0],
                                          mbmi->ref_frame[1] },
                                        mbmi->interinter_comp.type,
                                        mbmi->compound_idx,
                                        rd,
                                        pred_sse };
    interp_filter_stats[interp_filter_stats_idx] = stat;
    interp_filter_stats_idx++;
  }
  return interp_filter_stats_idx;
}